

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> * __thiscall
embree::XMLLoader::loadBinary<std::vector<embree::Vec2<int>,std::allocator<embree::Vec2<int>>>>
          (XMLLoader *this,Ref<embree::XML> *xml)

{
  runtime_error *prVar1;
  char *pcVar2;
  long __off;
  string *parmID;
  Vec2<int> *__ptr;
  size_type __n;
  string *psVar3;
  pointer in_RDX;
  long in_RSI;
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *in_RDI;
  size_t size;
  size_t ofs;
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *data;
  FileName *in_stack_fffffffffffffd48;
  char *in_stack_fffffffffffffd50;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  allocator_type *in_stack_fffffffffffffd60;
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  XML *in_stack_fffffffffffffd98;
  XML *this_01;
  string local_1f0 [37];
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> local_1cb;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [32];
  string local_160 [39];
  allocator local_139;
  string local_138 [32];
  string local_118 [32];
  string *local_f8;
  allocator local_e9;
  string local_e8 [32];
  undefined1 local_c8 [152];
  pointer local_30;
  pointer local_18;
  pointer local_10;
  
  if (*(long *)(in_RSI + 0x20) == 0) {
    local_c8[0x2b] = 1;
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    embree::FileName::str_abi_cxx11_(in_stack_fffffffffffffd48);
    std::operator+((char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    std::operator+(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    std::runtime_error::runtime_error(prVar1,(string *)(local_c8 + 0x78));
    local_c8[0x2b] = 0;
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_30 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"ofs",&local_e9);
  XML::parm(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  this_01 = (XML *)local_c8;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  __off = atol(pcVar2);
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  local_c8._32_8_ = __off;
  fseek(*(FILE **)(in_RSI + 0x20),__off,0);
  local_10 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"size",&local_139);
  XML::parm(this_01,in_stack_fffffffffffffd90);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  parmID = (string *)atol(pcVar2);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  local_f8 = parmID;
  if (parmID == (string *)0x0) {
    local_18 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"num",&local_181);
    XML::parm(this_01,parmID);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_f8 = (string *)atol(pcVar2);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
  }
  if ((ulong)(local_c8._32_8_ + (long)local_f8 * 8) <= *(ulong *)(in_RSI + 0x48)) {
    local_1cb.super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>._M_impl.
    super__Vector_impl_data._M_start._1_1_ = 0;
    this_00 = &local_1cb;
    psVar4 = local_f8;
    std::allocator<embree::Vec2<int>_>::allocator((allocator<embree::Vec2<int>_> *)0x3c553d);
    std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::vector
              (this_00,(size_type)psVar4,in_stack_fffffffffffffd60);
    std::allocator<embree::Vec2<int>_>::~allocator((allocator<embree::Vec2<int>_> *)0x3c5563);
    psVar4 = local_f8;
    __ptr = std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::data
                      ((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)0x3c557d);
    __n = std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::size(in_RDI);
    psVar3 = (string *)fread(__ptr,8,__n,*(FILE **)(in_RSI + 0x20));
    if (psVar4 == psVar3) {
      return in_RDI;
    }
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    embree::FileName::str_abi_cxx11_((FileName *)prVar1);
    std::operator+((char *)this_01,parmID);
    std::runtime_error::runtime_error(prVar1,local_1f0);
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1cb.super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>._M_impl.
  super__Vector_impl_data._M_start._2_1_ = 1;
  prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
  embree::FileName::str_abi_cxx11_(in_stack_fffffffffffffd48);
  std::operator+((char *)this_01,parmID);
  std::runtime_error::runtime_error(prVar1,local_1a8);
  local_1cb.super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>._M_impl.
  super__Vector_impl_data._M_start._2_1_ = 0;
  __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vector XMLLoader::loadBinary(const Ref<XML>& xml)
  {
    if (!binFile) 
      THROW_RUNTIME_ERROR("cannot open file "+binFileName.str()+" for reading");

    size_t ofs = atol(xml->parm("ofs").c_str());
    fseek(binFile,long(ofs),SEEK_SET);

    /* read size of array */
    size_t size = atol(xml->parm("size").c_str());
    if (size == 0) size = atol(xml->parm("num").c_str()); // version for BGF format

    /* perform security check that we stay in the file */
    if (ofs + size*sizeof(typename Vector::value_type) > binFileSize)
      THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());

    /* read data from file */
    Vector data(size);
    if (size != fread(data.data(), sizeof(typename Vector::value_type), data.size(), binFile)) 
      THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());

    return data;
  }